

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsPublicationPublishTime(HelicsPublication pub,HelicsTime val,HelicsError *err)

{
  PublicationObject *pPVar1;
  Time val_00;
  
  pPVar1 = anon_unknown.dwarf_7c49a::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    val_00.internalTimeCode = 0x7fffffffffffffff;
    if (val <= -9223372036.854765) {
      val_00.internalTimeCode = -0x7fffffffffffffff;
    }
    else if (val < 9223372036.854765) {
      val_00.internalTimeCode =
           (baseType)
           (val * 1000000000.0 + *(double *)(&DAT_00429020 + (ulong)(0.0 <= val * 1000000000.0) * 8)
           );
    }
    helics::Publication::publish(pPVar1->pubPtr,val_00);
  }
  return;
}

Assistant:

void helicsPublicationPublishTime(HelicsPublication pub, HelicsTime val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        const helics::Time tval(val);
        pubObj->pubPtr->publish(tval);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}